

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts3EvalTestDeferred(Fts3Cursor *pCsr,int *pRc)

{
  sqlite3_vtab *psVar1;
  sqlite3_stmt *pStmt;
  Fts3PhraseToken *pFVar2;
  int iVar3;
  int iVar4;
  Mem *pMem;
  uchar *z;
  Fts3DeferredToken *pFVar5;
  ulong iCol;
  bool bVar6;
  int rc;
  int nToken;
  sqlite3_tokenizer_cursor *pTC;
  int iDum2;
  int iDum1;
  char *zToken;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  sqlite3_tokenizer_cursor *local_68;
  int local_60;
  int local_5c;
  int *local_58;
  long local_50;
  sqlite3_module *local_48;
  i64 local_40;
  char *local_38;
  
  local_74 = *pRc;
  if (local_74 == 0) {
    if ((pCsr->pDeferred != (Fts3DeferredToken *)0x0) &&
       (local_74 = fts3CursorSeek((sqlite3_context *)0x0,pCsr), local_74 == 0)) {
      local_78 = 0;
      iVar4 = local_78;
      if (pCsr->pDeferred != (Fts3DeferredToken *)0x0) {
        psVar1 = (pCsr->base).pVtab;
        pStmt = pCsr->pStmt;
        local_48 = psVar1[3].pModule;
        local_50 = *(long *)&local_48->iVersion;
        local_58 = pRc;
        pMem = columnMem(pStmt,0);
        local_40 = sqlite3VdbeIntValue(pMem);
        columnMallocFailure(pStmt);
        if (0 < *(int *)&psVar1[2].pModule) {
          iCol = 0;
          do {
            if (psVar1[2].zErrMsg[iCol] == '\0') {
              z = sqlite3_column_text(pCsr->pStmt,(int)iCol + 1);
              local_68 = (sqlite3_tokenizer_cursor *)0x0;
              iVar4 = sqlite3Fts3OpenTokenizer
                                ((sqlite3_tokenizer *)local_48,pCsr->iLangid,(char *)z,-1,&local_68)
              ;
              while (local_78 = iVar4, iVar4 == 0) {
                local_6c = 0;
                local_5c = 0;
                local_60 = 0;
                local_70 = 0;
                local_78 = (**(code **)(local_50 + 0x28))
                                     (local_68,&local_38,&local_6c,&local_5c,&local_60,&local_70);
                pFVar5 = pCsr->pDeferred;
                iVar3 = local_70;
                while ((iVar4 = local_78, local_70 = iVar3, pFVar5 != (Fts3DeferredToken *)0x0 &&
                       (local_78 == 0))) {
                  pFVar2 = pFVar5->pToken;
                  if (((iCol == (uint)pFVar5->iCol) || (*(int *)&psVar1[2].pModule <= pFVar5->iCol))
                     && (iVar3 == 0 || pFVar2->bFirst == 0)) {
                    iVar4 = pFVar2->n;
                    if (((iVar4 == local_6c) || ((iVar4 < local_6c && (pFVar2->isPrefix != 0)))) &&
                       (iVar4 = bcmp(local_38,pFVar2->z,(long)iVar4), iVar4 == 0)) {
                      fts3PendingListAppend(&pFVar5->pList,local_40,iCol,(long)iVar3,&local_78);
                    }
                  }
                  pFVar5 = pFVar5->pNext;
                  iVar3 = local_70;
                }
              }
              if (local_68 != (sqlite3_tokenizer_cursor *)0x0) {
                (**(code **)(local_50 + 0x20))(local_68);
              }
              if (iVar4 == 0x65) {
                local_78 = 0;
              }
            }
            iCol = iCol + 1;
          } while (((long)iCol < (long)*(int *)&psVar1[2].pModule) && (local_78 == 0));
        }
        pRc = local_58;
        pFVar5 = pCsr->pDeferred;
        iVar4 = local_78;
        if (local_78 == 0 && pFVar5 != (Fts3DeferredToken *)0x0) {
          do {
            if (pFVar5->pList != (PendingList *)0x0) {
              iVar4 = fts3PendingListAppendVarint(&pFVar5->pList,0);
            }
            pFVar5 = pFVar5->pNext;
          } while ((pFVar5 != (Fts3DeferredToken *)0x0) && (iVar4 == 0));
        }
      }
      local_78 = iVar4;
      local_74 = local_78;
    }
    iVar4 = fts3EvalTestExpr(pCsr,pCsr->pExpr,&local_74);
    bVar6 = iVar4 == 0;
    for (pFVar5 = pCsr->pDeferred; pFVar5 != (Fts3DeferredToken *)0x0; pFVar5 = pFVar5->pNext) {
      sqlite3_free(pFVar5->pList);
      pFVar5->pList = (PendingList *)0x0;
    }
    *pRc = local_74;
  }
  else {
    bVar6 = false;
  }
  return (int)(byte)(local_74 == 0 & bVar6);
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3EvalTestDeferred(Fts3Cursor *pCsr, int *pRc){
  int rc = *pRc;
  int bMiss = 0;
  if( rc==SQLITE_OK ){

    /* If there are one or more deferred tokens, load the current row into
    ** memory and scan it to determine the position list for each deferred
    ** token. Then, see if this row is really a match, considering deferred
    ** tokens and NEAR operators (neither of which were taken into account
    ** earlier, by fts3EvalNextRow()). 
    */
    if( pCsr->pDeferred ){
      rc = fts3CursorSeek(0, pCsr);
      if( rc==SQLITE_OK ){
        rc = sqlite3Fts3CacheDeferredDoclists(pCsr);
      }
    }
    bMiss = (0==fts3EvalTestExpr(pCsr, pCsr->pExpr, &rc));

    /* Free the position-lists accumulated for each deferred token above. */
    sqlite3Fts3FreeDeferredDoclists(pCsr);
    *pRc = rc;
  }
  return (rc==SQLITE_OK && bMiss);
}